

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::BeginInitExpr(TypeChecker *this,Type type)

{
  pointer pTVar1;
  Label *__first;
  Label *__last;
  LabelType local_6c;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_68;
  unsigned_long local_50;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_48;
  
  pTVar1 = (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar1) {
    (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar1;
  }
  __first = (this->label_stack_).
            super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>.
            _M_impl.super__Vector_impl_data._M_start;
  __last = (this->label_stack_).
           super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__last != __first) {
    std::_Destroy_aux<false>::__destroy<wabt::TypeChecker::Label*>(__first,__last);
    (this->label_stack_).
    super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>._M_impl.
    super__Vector_impl_data._M_finish = __first;
  }
  local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start = type;
  local_6c = InitExpr;
  local_50 = (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
  local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<wabt::TypeChecker::Label,std::allocator<wabt::TypeChecker::Label>>::
  emplace_back<wabt::LabelType&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,unsigned_long>
            ((vector<wabt::TypeChecker::Label,std::allocator<wabt::TypeChecker::Label>> *)
             &this->label_stack_,&local_6c,&local_68,&local_48,&local_50);
  if (local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (Type *)0x0) {
    operator_delete(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)Ok;
}

Assistant:

Result TypeChecker::BeginInitExpr(Type type) {
  type_stack_.clear();
  label_stack_.clear();
  PushLabel(LabelType::InitExpr, TypeVector(), {type});
  return Result::Ok;
}